

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void template_conformglist(t_template *tfrom,t_template *tto,_glist *glist,int *conformaction)

{
  _outlet **wp;
  int iVar1;
  t_pd p_Var2;
  t_symbol *s;
  _outlet *p_Var3;
  _glist *p_Var4;
  _array *a;
  t_template *ptVar5;
  _glist *x;
  _glist *p_Var6;
  long lVar7;
  long lVar8;
  _glist *glist_00;
  t_gpointer local_48;
  
  glist_00 = (_glist *)glist->gl_list;
  do {
    if (glist_00 == (_glist *)0x0) {
      return;
    }
    p_Var2 = (glist_00->gl_obj).te_g.g_pd;
    if (p_Var2 == scalar_class) {
      s = (t_symbol *)(glist_00->gl_obj).te_binbuf;
      if (s == tfrom->t_sym) {
        gpointer_init(&local_48);
        x = (_glist *)getbytes((long)tto->t_n * 8 + 0x18);
        (x->gl_obj).te_g.g_pd = scalar_class;
        (x->gl_obj).te_binbuf = (_binbuf *)tfrom->t_sym;
        gpointer_setglist(&local_48,glist,(t_scalar *)x);
        wp = &(x->gl_obj).te_outlet;
        word_init((t_word *)wp,tto,&local_48);
        iVar1 = tto->t_n;
        if (0 < (long)iVar1) {
          lVar7 = 0;
          do {
            if (-1 < (long)conformaction[lVar7]) {
              p_Var3 = wp[lVar7];
              wp[lVar7] = (&(glist_00->gl_obj).te_outlet)[conformaction[lVar7]];
              (&(glist_00->gl_obj).te_outlet)[conformaction[lVar7]] = p_Var3;
            }
            lVar7 = lVar7 + 1;
          } while (iVar1 != lVar7);
        }
        p_Var4 = (_glist *)glist->gl_list;
        if ((_glist *)glist->gl_list == glist_00) {
          glist->gl_list = (t_gobj *)x;
          (x->gl_obj).te_g.g_next = (glist_00->gl_obj).te_g.g_next;
        }
        else {
          do {
            p_Var6 = p_Var4;
            p_Var4 = (_glist *)(p_Var6->gl_obj).te_g.g_next;
            if (p_Var4 == (_glist *)0x0) {
              bug("template_conformscalar");
              goto LAB_001587b7;
            }
          } while (p_Var4 != glist_00);
          (x->gl_obj).te_g.g_next = (p_Var4->gl_obj).te_g.g_next;
          (p_Var6->gl_obj).te_g.g_next = (_gobj *)x;
        }
LAB_001587b7:
        pd_free((t_pd *)glist_00);
        ptVar5 = tto;
      }
      else {
        ptVar5 = (t_template *)pd_findbyclass(s,template_class);
        x = glist_00;
      }
      glist_00 = x;
      if (0 < ptVar5->t_n) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          if (*(int *)((long)&ptVar5->t_vec->ds_type + lVar7) == 3) {
            template_conformarray(tfrom,tto,conformaction,(_array *)(&(x->gl_obj).te_outlet)[lVar8])
            ;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (lVar8 < ptVar5->t_n);
      }
    }
    else if (p_Var2 == canvas_class) {
      template_conformglist(tfrom,tto,glist_00,conformaction);
    }
    else if (p_Var2 == garray_class) {
      a = garray_getarray((_garray *)glist_00);
      template_conformarray(tfrom,tto,conformaction,a);
    }
    glist_00 = (_glist *)(glist_00->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void template_conformglist(t_template *tfrom, t_template *tto,
    t_glist *glist,  int *conformaction)
{
    t_gobj *g;
    /* post("conform glist %s", glist->gl_name->s_name); */
    for (g = glist->gl_list; g; g = g->g_next)
    {
        if (pd_class(&g->g_pd) == scalar_class)
            g = &template_conformscalar(tfrom, tto, conformaction,
                glist, (t_scalar *)g)->sc_gobj;
        else if (pd_class(&g->g_pd) == canvas_class)
            template_conformglist(tfrom, tto, (t_glist *)g, conformaction);
        else if (pd_class(&g->g_pd) == garray_class)
            template_conformarray(tfrom, tto, conformaction,
                garray_getarray((t_garray *)g));
    }
}